

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

bool CoreML::Specification::ArrayFeatureType_ArrayDataType_IsValid(int value)

{
  bool local_9;
  int value_local;
  
  if ((((value == 0) || (value == 0x10010)) || (value == 0x10020)) ||
     ((value == 0x10040 || (value == 0x20020)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool ArrayFeatureType_ArrayDataType_IsValid(int value) {
  switch (value) {
    case 0:
    case 65552:
    case 65568:
    case 65600:
    case 131104:
      return true;
    default:
      return false;
  }
}